

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

void __thiscall t_go_generator::generate_service_interface(t_go_generator *this,t_service *tservice)

{
  t_function *tfunction;
  bool bVar1;
  string *value;
  t_service *ptVar2;
  ostream *poVar3;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar4;
  string local_378;
  allocator local_351;
  string local_350;
  string local_330;
  string local_310;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_2f0;
  t_function **local_2e8;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_2e0;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  long local_e0;
  size_t index;
  string local_b8 [8];
  string interfaceName;
  string serviceName;
  string local_70 [8];
  string extends_if;
  allocator local_39;
  undefined1 local_38 [8];
  string extends;
  t_service *tservice_local;
  t_go_generator *this_local;
  
  extends.field_2._8_8_ = tservice;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",(allocator *)(serviceName.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(serviceName.field_2._M_local_buf + 0xf));
  value = (string *)(**(code **)(*(long *)extends.field_2._8_8_ + 0x18))();
  publicize((string *)((long)&interfaceName.field_2 + 8),this,value,false);
  std::__cxx11::string::string(local_b8,(string *)(interfaceName.field_2._M_local_buf + 8));
  ptVar2 = t_service::get_extends((t_service *)extends.field_2._8_8_);
  if (ptVar2 != (t_service *)0x0) {
    ptVar2 = t_service::get_extends((t_service *)extends.field_2._8_8_);
    type_name_abi_cxx11_((string *)&index,this,&ptVar2->super_t_type);
    std::__cxx11::string::operator=((string *)local_38,(string *)&index);
    std::__cxx11::string::~string((string *)&index);
    local_e0 = std::__cxx11::string::rfind((char *)local_38,0x4e5538);
    if (local_e0 == -1) {
      t_generator::indent_abi_cxx11_(&local_280,&this->super_t_generator);
      std::operator+(&local_260,"\n",&local_280);
      publicize(&local_2a0,this,(string *)local_38,false);
      std::operator+(&local_240,&local_260,&local_2a0);
      std::operator+(&local_220,&local_240,"\n");
      std::__cxx11::string::operator=(local_70,(string *)&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_1a0,&this->super_t_generator);
      std::operator+(&local_180,"\n",&local_1a0);
      std::operator+(&local_160,&local_180,"  ");
      std::__cxx11::string::substr((ulong)&local_1c0,(ulong)local_38);
      std::operator+(&local_140,&local_160,&local_1c0);
      std::__cxx11::string::substr((ulong)&local_200,(ulong)local_38);
      publicize(&local_1e0,this,&local_200,false);
      std::operator+(&local_120,&local_140,&local_1e0);
      std::operator+(&local_100,&local_120,"\n");
      std::__cxx11::string::operator=(local_70,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
    }
  }
  t_generator::indent_abi_cxx11_
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_types_,
                           (string *)
                           &functions.
                            super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  poVar3 = std::operator<<(poVar3,"type ");
  poVar3 = std::operator<<(poVar3,local_b8);
  poVar3 = std::operator<<(poVar3," interface {");
  std::operator<<(poVar3,local_70);
  std::__cxx11::string::~string
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  t_generator::indent_up(&this->super_t_generator);
  generate_go_docstring(this,(ostream *)&this->f_types_,(t_doc *)extends.field_2._8_8_);
  __x = t_service::get_functions((t_service *)extends.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  bVar1 = std::vector<t_function_*,_std::allocator<t_function_*>_>::empty
                    ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  if (!bVar1) {
    std::operator<<((ostream *)&this->f_types_,(string *)&::endl_abi_cxx11_);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    __normal_iterator(&local_2e0);
    local_2e8 = (t_function **)
                std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                          ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    local_2e0._M_current = local_2e8;
    while( true ) {
      local_2f0._M_current =
           (t_function **)
           std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                     ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
      bVar1 = __gnu_cxx::operator!=(&local_2e0,&local_2f0);
      if (!bVar1) break;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_2e0);
      generate_go_docstring(this,(ostream *)&this->f_types_,*pptVar4);
      t_generator::indent_abi_cxx11_(&local_310,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_types_,(string *)&local_310);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_2e0);
      tfunction = *pptVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_350,"",&local_351);
      function_signature_if(&local_330,this,tfunction,&local_350,true);
      poVar3 = std::operator<<(poVar3,(string *)&local_330);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator((allocator<char> *)&local_351);
      std::__cxx11::string::~string((string *)&local_310);
      __gnu_cxx::
      __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
      operator++(&local_2e0);
    }
  }
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_378,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_types_,(string *)&local_378);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_378);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)(interfaceName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_go_generator::generate_service_interface(t_service* tservice) {
  string extends = "";
  string extends_if = "";
  string serviceName(publicize(tservice->get_name()));
  string interfaceName = serviceName;

  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    size_t index = extends.rfind(".");

    if (index != string::npos) {
      extends_if = "\n" + indent() + "  " + extends.substr(0, index + 1)
                   + publicize(extends.substr(index + 1)) + "\n";
    } else {
      extends_if = "\n" + indent() + publicize(extends) + "\n";
    }
  }

  f_types_ << indent() << "type " << interfaceName << " interface {" << extends_if;
  indent_up();
  generate_go_docstring(f_types_, tservice);
  vector<t_function*> functions = tservice->get_functions();

  if (!functions.empty()) {
    f_types_ << endl;
    vector<t_function*>::iterator f_iter;

    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
      generate_go_docstring(f_types_, (*f_iter));
      f_types_ << indent() << function_signature_if(*f_iter, "", true) << endl;
    }
  }

  indent_down();
  f_types_ << indent() << "}" << endl << endl;
}